

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenDiskFile(DiskSourceTree *this,string *filename)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  bool bVar4;
  FileInputStream *result;
  int file_descriptor;
  int ret;
  stat sb;
  string *filename_local;
  DiskSourceTree *this_local;
  
  sb.__glibc_reserved[2] = (__syscall_slong_t)filename;
  do {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = stat(pcVar2,(stat *)&file_descriptor);
    bVar4 = false;
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  if ((iVar1 == 0) && (((uint)sb.st_nlink & 0xf000) == 0x4000)) {
    std::__cxx11::string::operator=
              ((string *)&this->last_error_message_,"Input file is a directory.");
    this_local = (DiskSourceTree *)0x0;
  }
  else {
    do {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = open(pcVar2,0);
      bVar4 = false;
      if (iVar1 < 0) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    if (iVar1 < 0) {
      this_local = (DiskSourceTree *)0x0;
    }
    else {
      this_local = (DiskSourceTree *)operator_new(0x58);
      io::FileInputStream::FileInputStream((FileInputStream *)this_local,iVar1,-1);
      io::FileInputStream::SetCloseOnDelete((FileInputStream *)this_local,true);
    }
  }
  return (ZeroCopyInputStream *)this_local;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenDiskFile(
    const std::string& filename) {
  struct stat sb;
  int ret = 0;
  do {
    ret = stat(filename.c_str(), &sb);
  } while (ret != 0 && errno == EINTR);
#if defined(_WIN32)
  if (ret == 0 && sb.st_mode & S_IFDIR) {
    last_error_message_ = "Input file is a directory.";
    return NULL;
  }
#else
  if (ret == 0 && S_ISDIR(sb.st_mode)) {
    last_error_message_ = "Input file is a directory.";
    return NULL;
  }
#endif
  int file_descriptor;
  do {
    file_descriptor = open(filename.c_str(), O_RDONLY);
  } while (file_descriptor < 0 && errno == EINTR);
  if (file_descriptor >= 0) {
    io::FileInputStream* result = new io::FileInputStream(file_descriptor);
    result->SetCloseOnDelete(true);
    return result;
  } else {
    return NULL;
  }
}